

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test32(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  undefined4 uVar2;
  
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3c9,"void test32(const char *, const char *, const char *, const char *)");
  }
  uVar2 = qpdf_get_object_by_id(qpdf,3,0);
  iVar1 = qpdf_oh_is_dictionary(qpdf,uVar2);
  if (iVar1 != 0) {
    iVar1 = qpdf_oh_has_key(qpdf,uVar2,"/MediaBox");
    if (iVar1 != 0) {
      report_errors();
      return;
    }
    __assert_fail("qpdf_oh_has_key(qpdf, page, \"/MediaBox\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3cc,"void test32(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_oh_is_dictionary(qpdf, page)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x3cb,"void test32(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test32(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test case is designed for minimal.pdf. */
    assert(qpdf_read(qpdf, infile, password) == 0);
    qpdf_oh page = qpdf_get_object_by_id(qpdf, 3, 0);
    assert(qpdf_oh_is_dictionary(qpdf, page));
    assert(qpdf_oh_has_key(qpdf, page, "/MediaBox"));
    report_errors();
}